

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

void __thiscall
spectest::AssertModuleCommand<(wabt::CommandType)4>::AssertModuleCommand
          (AssertModuleCommand<(wabt::CommandType)4> *this)

{
  (this->super_CommandMixin<(wabt::CommandType)4>).super_Command.type = AssertMalformed;
  (this->super_CommandMixin<(wabt::CommandType)4>).super_Command.line = 0;
  (this->super_CommandMixin<(wabt::CommandType)4>).super_Command._vptr_Command =
       (_func_int **)&PTR__AssertModuleCommand_001d4d80;
  this->type = Binary;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit Command(CommandType type) : type(type) {}